

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_unsigned_char>::
     Load(istream *in,vector<unsigned_char,_std::allocator<unsigned_char>_> *object)

{
  pointer puVar1;
  size_t i;
  ulong uVar2;
  uint local_30;
  uchar local_29;
  uint32_t size;
  uchar obj;
  
  std::istream::read((char *)in,(long)&local_30);
  puVar1 = (object->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((object->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (object->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(object,(ulong)local_30);
  for (uVar2 = 0; uVar2 < local_30; uVar2 = uVar2 + 1) {
    TPodSerializer<unsigned_char>::Load(in,&local_29);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (object,&local_29);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }